

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaOP.cpp
# Opt level: O2

void __thiscall OmegaOP::~OmegaOP(OmegaOP *this)

{
  ulong uVar1;
  uint i;
  long lVar2;
  ulong uVar3;
  
  operator_delete(this->states);
  this->states = (double *)0x0;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    operator_delete(this->S12P[lVar2]);
  }
  for (uVar3 = 0; uVar1 = (ulong)this->nbStates, uVar3 < uVar1; uVar3 = uVar3 + 1) {
    operator_delete(this->Q[uVar3]);
  }
  for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
    operator_delete(this->lastChpt[uVar3]);
    uVar1 = (ulong)this->nbStates;
  }
  for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
    operator_delete(this->lastIndState[uVar3]);
    uVar1 = (ulong)this->nbStates;
  }
  if (this->S12P != (double **)0x0) {
    operator_delete__(this->S12P);
  }
  this->S12P = (double **)0x0;
  if (this->Q != (double **)0x0) {
    operator_delete__(this->Q);
  }
  this->Q = (double **)0x0;
  if (this->lastChpt != (uint **)0x0) {
    operator_delete__(this->lastChpt);
  }
  this->lastChpt = (uint **)0x0;
  if (this->lastIndState != (uint **)0x0) {
    operator_delete__(this->lastIndState);
  }
  this->lastIndState = (uint **)0x0;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->parameters).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->changepoints).super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

OmegaOP::~OmegaOP()
{
  delete(states);
  states = NULL;
  for(unsigned int i = 0; i < 3; i++){delete(S12P[i]);}
  for(unsigned int i = 0; i < nbStates; i++){delete(Q[i]);}
  for(unsigned int i = 0; i < nbStates; i++){delete(lastChpt[i]);}
  for(unsigned int i = 0; i < nbStates; i++){delete(lastIndState[i]);}
  delete [] S12P;
  S12P = NULL;
  delete [] Q;
  Q = NULL;
  delete [] lastChpt;
  lastChpt = NULL;
  delete [] lastIndState;
  lastIndState = NULL;
}